

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O3

void __thiscall APITests::test_setup_all0(APITests *this)

{
  pointer piVar1;
  undefined8 in_RAX;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var2;
  pointer piVar3;
  int pin;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  GPIO::setmode(BOARD);
  piVar3 = (this->all_board_pins).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (this->all_board_pins).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar3 != piVar1) {
    do {
      uStack_28 = CONCAT44(*piVar3,(undefined4)uStack_28);
      _Var2 = std::
              __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        ((this->pin_data).unimplemented_pins.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (this->pin_data).unimplemented_pins.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)&uStack_28 + 4);
      if (_Var2._M_current ==
          (this->pin_data).unimplemented_pins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        GPIO::setup(uStack_28._4_4_,IN,-1);
      }
      piVar3 = piVar3 + 1;
    } while (piVar3 != piVar1);
  }
  GPIO::cleanup();
  return;
}

Assistant:

void test_setup_all0()
    {
        GPIO::setmode(GPIO::BOARD);
        for (auto pin : all_board_pins)
        {
            if (is_in(pin, pin_data.unimplemented_pins))
                continue;
            GPIO::setup(pin, GPIO::IN);
        }
        GPIO::cleanup();
    }